

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O0

void Cut_CellDumpToFile(void)

{
  Cut_CMan_t *pCVar1;
  abctime aVar2;
  FILE *__stream;
  abctime aVar3;
  int aiStack_cb8 [629];
  int local_2e4;
  abctime clk;
  uint local_2c0;
  int Counter;
  int k;
  int i;
  int BoxUsed [22] [5];
  uint local_f8 [2];
  int NumUsed [10] [5];
  char *pFileName;
  Cut_Cell_t *pTemp;
  Cut_CMan_t *p;
  FILE *pFile;
  
  pCVar1 = s_pCMan;
  memset(local_f8,0,200);
  memset(&k,0,0x1b8);
  aVar2 = Abc_Clock();
  if (pCVar1 == (Cut_CMan_t *)0x0) {
    printf("Cut_CellDumpToFile: Cell manager is not defined.\n");
  }
  else {
    for (local_2c0 = 9; -1 < (int)local_2c0; local_2c0 = local_2c0 + -1) {
      for (pFileName = (char *)pCVar1->pSameVar[(int)local_2c0]; pFileName != (char *)0x0;
          pFileName = *(char **)(pFileName + 8)) {
        if (*(int *)(pFileName + 0x18) == 0) {
          local_f8[(long)(int)local_2c0 * 5] = local_f8[(long)(int)local_2c0 * 5] + 1;
        }
        else if (*(int *)(pFileName + 0x18) < 10) {
          NumUsed[(long)(int)local_2c0 + -1][4] = NumUsed[(long)(int)local_2c0 + -1][4] + 1;
        }
        else if (*(int *)(pFileName + 0x18) < 100) {
          NumUsed[(int)local_2c0][0] = NumUsed[(int)local_2c0][0] + 1;
        }
        else if (*(int *)(pFileName + 0x18) < 1000) {
          NumUsed[(int)local_2c0][1] = NumUsed[(int)local_2c0][1] + 1;
        }
        else {
          NumUsed[(int)local_2c0][2] = NumUsed[(int)local_2c0][2] + 1;
        }
        for (Counter = 0; Counter < 4; Counter = Counter + 1) {
          if (*(int *)(pFileName + 0x18) == 0) {
            (&k)[(long)(int)pFileName[(long)Counter + 0x1c] * 5] =
                 (&k)[(long)(int)pFileName[(long)Counter + 0x1c] * 5] + 1;
          }
          else if (*(int *)(pFileName + 0x18) < 10) {
            BoxUsed[(long)(int)pFileName[(long)Counter + 0x1c] + -1][4] =
                 BoxUsed[(long)(int)pFileName[(long)Counter + 0x1c] + -1][4] + 1;
          }
          else if (*(int *)(pFileName + 0x18) < 100) {
            BoxUsed[(int)pFileName[(long)Counter + 0x1c]][0] =
                 BoxUsed[(int)pFileName[(long)Counter + 0x1c]][0] + 1;
          }
          else if (*(int *)(pFileName + 0x18) < 1000) {
            BoxUsed[(int)pFileName[(long)Counter + 0x1c]][1] =
                 BoxUsed[(int)pFileName[(long)Counter + 0x1c]][1] + 1;
          }
          else {
            BoxUsed[(int)pFileName[(long)Counter + 0x1c]][2] =
                 BoxUsed[(int)pFileName[(long)Counter + 0x1c]][2] + 1;
          }
        }
      }
    }
    printf("Functions found = %10d.  Functions not found = %10d.\n",(ulong)(uint)pCVar1->nCellFound,
           (ulong)(uint)pCVar1->nCellNotFound);
    for (local_2c0 = 0; (int)local_2c0 < 10; local_2c0 = local_2c0 + 1) {
      printf("%3d  : ",(ulong)local_2c0);
      for (Counter = 0; Counter < 5; Counter = Counter + 1) {
        printf("%8d ",(ulong)local_f8[(long)(int)local_2c0 * 5 + (long)Counter]);
      }
      printf("\n");
    }
    printf("Box usage:\n");
    for (local_2c0 = 0; (int)local_2c0 < 0x16; local_2c0 = local_2c0 + 1) {
      printf("%3d  : ",(ulong)local_2c0);
      for (Counter = 0; Counter < 5; Counter = Counter + 1) {
        printf("%8d ",(ulong)(uint)(&k)[(long)(int)local_2c0 * 5 + (long)Counter]);
      }
      printf("  %s",s_NP3Names[(int)local_2c0]);
      printf("\n");
    }
    __stream = fopen("celllib22.txt","w");
    if (__stream == (FILE *)0x0) {
      printf("Cut_CellDumpToFile: Cannout open output file.\n");
    }
    else {
      clk._4_4_ = 0;
      for (local_2c0 = 0; (int)local_2c0 < 10; local_2c0 = local_2c0 + 1) {
        for (pFileName = (char *)pCVar1->pSameVar[(int)local_2c0]; pFileName != (char *)0x0;
            pFileName = *(char **)(pFileName + 8)) {
          if (0 < *(int *)(pFileName + 0x18)) {
            if ((int)local_2c0 < 6) {
              local_2e4 = 5;
            }
            else {
              local_2e4 = local_2c0;
            }
            Extra_PrintHexadecimal((FILE *)__stream,(uint *)(pFileName + 0x54),local_2e4);
            fprintf(__stream,"\n");
            clk._4_4_ = clk._4_4_ + 1;
          }
        }
        fprintf(__stream,"\n");
      }
      fclose(__stream);
      printf("Library composed of %d functions is written into file \"%s\".  ",(ulong)clk._4_4_,
             "celllib22.txt");
      Abc_Print(1,"%s =","Time");
      aVar3 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - aVar2) * 1.0) / 1000000.0);
    }
  }
  return;
}

Assistant:

void Cut_CellDumpToFile()
{
    FILE * pFile;
    Cut_CMan_t * p = s_pCMan;
    Cut_Cell_t * pTemp;
    char * pFileName = "celllib22.txt";
    int NumUsed[10][5] = {{0}};
    int BoxUsed[22][5] = {{0}};
    int i, k, Counter;
    abctime clk = Abc_Clock();

    if ( p == NULL )
    {
        printf( "Cut_CellDumpToFile: Cell manager is not defined.\n" );
        return;
    }

    // count the number of cells used
    for ( k = CUT_CELL_MVAR; k >= 0; k-- )
    {
        for ( pTemp = p->pSameVar[k]; pTemp; pTemp = pTemp->pNextVar )
        {
            if ( pTemp->nUsed == 0 )
                NumUsed[k][0]++;
            else if ( pTemp->nUsed < 10 )
                NumUsed[k][1]++;
            else if ( pTemp->nUsed < 100 )
                NumUsed[k][2]++;
            else if ( pTemp->nUsed < 1000 )
                NumUsed[k][3]++;
            else 
                NumUsed[k][4]++;

            for ( i = 0; i < 4; i++ )
                if ( pTemp->nUsed == 0 )
                    BoxUsed[ (int)pTemp->Box[i] ][0]++;
                else if ( pTemp->nUsed < 10 )
                    BoxUsed[ (int)pTemp->Box[i] ][1]++;
                else if ( pTemp->nUsed < 100 )
                    BoxUsed[ (int)pTemp->Box[i] ][2]++;
                else if ( pTemp->nUsed < 1000 )
                    BoxUsed[ (int)pTemp->Box[i] ][3]++;
                else 
                    BoxUsed[ (int)pTemp->Box[i] ][4]++;
        }
    }

    printf( "Functions found = %10d.  Functions not found = %10d.\n", p->nCellFound, p->nCellNotFound );
    for ( k = 0; k <= CUT_CELL_MVAR; k++ )
    {
        printf( "%3d  : ", k );
        for ( i = 0; i < 5; i++ ) 
            printf( "%8d ", NumUsed[k][i] );
        printf( "\n" );
    }
    printf( "Box usage:\n" );
    for ( k = 0; k < 22; k++ )
    {
        printf( "%3d  : ", k );
        for ( i = 0; i < 5; i++ ) 
            printf( "%8d ", BoxUsed[k][i] );
        printf( "  %s", s_NP3Names[k] );
        printf( "\n" );
    }

    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cut_CellDumpToFile: Cannout open output file.\n" );
        return;
    }

    Counter = 0;
    for ( k = 0; k <= CUT_CELL_MVAR; k++ )
    {
        for ( pTemp = p->pSameVar[k]; pTemp; pTemp = pTemp->pNextVar )
            if ( pTemp->nUsed > 0 )
            {
                Extra_PrintHexadecimal( pFile, pTemp->uTruth, (k <= 5? 5 : k) );
                fprintf( pFile, "\n" );
                Counter++;
            }
        fprintf( pFile, "\n" );
    }
    fclose( pFile );

    printf( "Library composed of %d functions is written into file \"%s\".  ", Counter, pFileName );

    ABC_PRT( "Time", Abc_Clock() - clk );
}